

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupCones(Gia_Man_t *p,int *pPos,int nPos,int fTrimPis)

{
  uint uVar1;
  char *pcVar2;
  void *pvVar3;
  ulong *puVar4;
  int iVar5;
  Vec_Ptr_t *vLeaves;
  void **ppvVar6;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vRoots;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  Gia_Obj_t *pGVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  
  vLeaves = (Vec_Ptr_t *)malloc(0x10);
  vLeaves->nCap = 100;
  vLeaves->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  vLeaves->pArray = ppvVar6;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  vNodes->pArray = ppvVar6;
  vRoots = (Vec_Ptr_t *)malloc(0x10);
  vRoots->nCap = 100;
  vRoots->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  vRoots->pArray = ppvVar6;
  uVar16 = (ulong)(uint)nPos;
  if (0 < nPos) {
    uVar17 = 0;
    do {
      uVar1 = pPos[uVar17];
      iVar5 = p->vCos->nSize;
      if (iVar5 - p->nRegs <= (int)uVar1) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar1 < 0) || (iVar5 <= (int)uVar1)) goto LAB_00680385;
      iVar5 = p->vCos->pArray[uVar1];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00680366;
      pGVar12 = p->pObjs;
      uVar1 = vRoots->nCap;
      if (vRoots->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (vRoots->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vRoots->pArray,0x80);
          }
          iVar15 = 0x10;
        }
        else {
          iVar15 = uVar1 * 2;
          if (iVar15 <= (int)uVar1) goto LAB_0067fd92;
          if (vRoots->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(vRoots->pArray,(ulong)uVar1 << 4);
          }
        }
        vRoots->pArray = ppvVar6;
        vRoots->nCap = iVar15;
      }
LAB_0067fd92:
      iVar15 = vRoots->nSize;
      vRoots->nSize = iVar15 + 1;
      vRoots->pArray[iVar15] = pGVar12 + iVar5;
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  Gia_ManIncrementTravId(p);
  if (p->nObjs < 1) {
LAB_00680328:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->nTravIdsAlloc < 1) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x227,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  *p->pTravIds = p->nTravIds;
  if (0 < vRoots->nSize) {
    lVar18 = 0;
    do {
      Gia_ManDupCones_rec(p,(Gia_Obj_t *)vRoots->pArray[lVar18],vLeaves,vNodes,vRoots);
      lVar18 = lVar18 + 1;
    } while (lVar18 < vRoots->nSize);
  }
  if (1 < (long)vLeaves->nSize) {
    qsort(vLeaves->pArray,(long)vLeaves->nSize,8,Gia_ObjCompareByCioId);
  }
  p_00 = Gia_ManStart(vRoots->nSize + vLeaves->nSize + vNodes->nSize + 1);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pName = pcVar8;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pSpec = pcVar8;
  p->pObjs->Value = 0;
  if (fTrimPis == 0) {
    pVVar10 = p->vCis;
    uVar17 = (ulong)(uint)pVVar10->nSize;
    if (p->nRegs < pVVar10->nSize) {
      lVar18 = 0;
      do {
        if ((int)uVar17 <= lVar18) {
LAB_00680385:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = pVVar10->pArray[lVar18];
        if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_00680366:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar12 = p->pObjs;
        if (pGVar12 == (Gia_Obj_t *)0x0) break;
        pGVar11 = Gia_ManAppendObj(p_00);
        uVar17 = *(ulong *)pGVar11;
        *(ulong *)pGVar11 = uVar17 | 0x9fffffff;
        *(ulong *)pGVar11 =
             uVar17 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar9 = p_00->pObjs;
        if ((pGVar11 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar11)) goto LAB_00680328;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar9) >> 2) * -0x55555555);
        pGVar9 = p_00->pObjs;
        if ((pGVar11 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar11)) goto LAB_00680328;
        pGVar12[iVar5].Value = (int)((ulong)((long)pGVar11 - (long)pGVar9) >> 2) * 0x55555556;
        lVar18 = lVar18 + 1;
        pVVar10 = p->vCis;
        uVar17 = (ulong)pVVar10->nSize;
      } while (lVar18 < (long)(uVar17 - (long)p->nRegs));
    }
  }
  else if (0 < vLeaves->nSize) {
    lVar18 = 0;
    do {
      pvVar3 = vLeaves->pArray[lVar18];
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar17 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar17 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar17 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar12 = p_00->pObjs;
      if ((pGVar9 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar9)) goto LAB_00680328;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar12) >> 2) * -0x55555555);
      pGVar12 = p_00->pObjs;
      if ((pGVar9 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar9)) goto LAB_00680328;
      *(int *)((long)pvVar3 + 8) = (int)((ulong)((long)pGVar9 - (long)pGVar12) >> 2) * 0x55555556;
      lVar18 = lVar18 + 1;
    } while (lVar18 < vLeaves->nSize);
  }
  if (nPos < vRoots->nSize) {
    do {
      if (nPos < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pGVar12 = (Gia_Obj_t *)vRoots->pArray[uVar16];
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar17 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar17 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar17 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar9 = p_00->pObjs;
      if ((pGVar11 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar11)) goto LAB_00680328;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar9) >> 2) * -0x55555555);
      pGVar9 = p_00->pObjs;
      if ((pGVar11 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar11)) goto LAB_00680328;
      pGVar12 = Gia_ObjRiToRo(p,pGVar12);
      pGVar12->Value = (int)((ulong)((long)pGVar11 - (long)pGVar9) >> 2) * 0x55555556;
      uVar16 = uVar16 + 1;
    } while ((int)uVar16 < vRoots->nSize);
  }
  if (0 < vNodes->nSize) {
    lVar18 = 0;
    do {
      puVar4 = (ulong *)vNodes->pArray[lVar18];
      uVar16 = *puVar4;
      uVar1 = *(uint *)((long)puVar4 + (ulong)((uint)uVar16 & 0x1fffffff) * -0xc + 8);
      if ((int)uVar1 < 0) goto LAB_00680347;
      uVar13 = (uint)(uVar16 >> 0x20);
      uVar14 = *(uint *)((long)puVar4 + (ulong)(uVar13 & 0x1fffffff) * -0xc + 8);
      if ((int)uVar14 < 0) goto LAB_00680347;
      iVar5 = Gia_ManAppendAnd(p_00,(uint)(uVar16 >> 0x1d) & 1 ^ uVar1,uVar14 ^ uVar13 >> 0x1d & 1);
      *(int *)(puVar4 + 1) = iVar5;
      lVar18 = lVar18 + 1;
    } while (lVar18 < vNodes->nSize);
  }
  iVar5 = vRoots->nSize;
  if (0 < iVar5) {
    lVar18 = 0;
    do {
      uVar14 = (uint)*vRoots->pArray[lVar18];
      uVar1 = *(uint *)((long)vRoots->pArray[lVar18] + (ulong)(uVar14 & 0x1fffffff) * -0xc + 8);
      if ((int)uVar1 < 0) {
LAB_00680347:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar14 >> 0x1d & 1 ^ uVar1);
      lVar18 = lVar18 + 1;
      iVar5 = vRoots->nSize;
    } while (lVar18 < iVar5);
  }
  Gia_ManSetRegNum(p_00,iVar5 - nPos);
  if (vLeaves->pArray != (void **)0x0) {
    free(vLeaves->pArray);
    vLeaves->pArray = (void **)0x0;
  }
  free(vLeaves);
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (void **)0x0;
  }
  free(vNodes);
  if (vRoots->pArray != (void **)0x0) {
    free(vRoots->pArray);
    vRoots->pArray = (void **)0x0;
  }
  free(vRoots);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupCones( Gia_Man_t * p, int * pPos, int nPos, int fTrimPis )
{
    Gia_Man_t * pNew;
    Vec_Ptr_t * vLeaves, * vNodes, * vRoots;
    Gia_Obj_t * pObj;
    int i;

    // collect initial POs
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes = Vec_PtrAlloc( 100 );
    vRoots = Vec_PtrAlloc( 100 );
    for ( i = 0; i < nPos; i++ )
        Vec_PtrPush( vRoots, Gia_ManPo(p, pPos[i]) );

    // mark internal nodes
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManDupCones_rec( p, pObj, vLeaves, vNodes, vRoots );
    Vec_PtrSort( vLeaves, (int (*)(void))Gia_ObjCompareByCioId );

    // start the new manager
//    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Vec_PtrSize(vLeaves) + Vec_PtrSize(vNodes) + Vec_PtrSize(vRoots) + 1);
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // map the constant node
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    if ( fTrimPis )
    {
        Vec_PtrForEachEntry( Gia_Obj_t *, vLeaves, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    // create LOs
    Vec_PtrForEachEntryStart( Gia_Obj_t *, vRoots, pObj, i, nPos )
        Gia_ObjRiToRo(p, pObj)->Value = Gia_ManAppendCi( pNew );
    // create internal nodes
    Vec_PtrForEachEntry( Gia_Obj_t *, vNodes, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create COs
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // finalize
    Gia_ManSetRegNum( pNew, Vec_PtrSize(vRoots)-nPos );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vRoots );
    return pNew;

}